

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O2

void __thiscall ON_PolyCurve::Dump(ON_PolyCurve *this,ON_TextLog *dump)

{
  uint uVar1;
  ON_Curve *pOVar2;
  double *pdVar3;
  double dVar4;
  bool bVar5;
  ulong uVar6;
  char *format;
  undefined4 uVar7;
  undefined4 uVar8;
  ON_3dPoint segment_end;
  ON_3dPoint segment_start;
  ON_3dPoint local_78;
  ON_3dPoint local_60;
  ON_3dPoint local_48;
  
  uVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  local_48.z = ON_3dPoint::UnsetPoint.z;
  local_48.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
  local_48.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
  local_48.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
  local_48.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
  local_78.z = ON_3dPoint::UnsetPoint.z;
  local_78.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
  local_78.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
  local_78.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
  local_78.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
  ON_TextLog::Print(dump,"ON_PolyCurve segment count = %d\n",(ulong)uVar1);
  ON_TextLog::PushIndent(dump);
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  uVar6 = 0;
  do {
    if (uVar1 == uVar6) {
      ON_TextLog::PopIndent(dump);
      return;
    }
    pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar6];
    if (pOVar2 == (ON_Curve *)0x0) {
      local_48.z = ON_3dPoint::UnsetPoint.z;
      local_48.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
      local_48.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
      local_48.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
      local_48.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
    }
    else {
      ON_Curve::PointAtStart(&local_60,pOVar2);
      local_48.z = local_60.z;
      local_48.x._0_4_ = local_60.x._0_4_;
      local_48.x._4_4_ = local_60.x._4_4_;
      local_48.y._0_4_ = local_60.y._0_4_;
      local_48.y._4_4_ = local_60.y._4_4_;
    }
    bVar5 = ON_3dPoint::IsValid(&local_48);
    uVar7 = 0x9e331dd2;
    uVar8 = 0xffe5f8bd;
    if (bVar5) {
      bVar5 = ON_3dPoint::IsValid(&local_78);
      uVar7 = 0x9e331dd2;
      uVar8 = 0xffe5f8bd;
      if (bVar5) {
        dVar4 = ON_3dPoint::DistanceTo(&local_48,&local_78);
        uVar7 = SUB84(dVar4,0);
        uVar8 = (undefined4)((ulong)dVar4 >> 0x20);
      }
    }
    pdVar3 = (this->m_t).m_a;
    ON_TextLog::Print(dump,"Segment %d: (%g,%g)",SUB84(pdVar3[uVar6],0),pdVar3[uVar6 + 1],
                      (ulong)((int)uVar6 + 1));
    if (uVar6 != 0) {
      bVar5 = ON_IsValid((double)CONCAT44(uVar8,uVar7));
      if (bVar5) {
        ON_TextLog::Print(dump," gap = %.17g",uVar7);
      }
      else {
        bVar5 = ON_3dPoint::IsValid(&local_48);
        if (bVar5) {
          bVar5 = ON_3dPoint::IsValid(&local_78);
          if (bVar5) goto LAB_00591854;
          format = " invalid previous segment curve";
        }
        else {
          format = " invalid segment curve";
        }
        ON_TextLog::Print(dump,format);
      }
    }
LAB_00591854:
    ON_TextLog::Print(dump,"\n");
    ON_TextLog::PushIndent(dump);
    pOVar2 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar6];
    if (pOVar2 == (ON_Curve *)0x0) {
      ON_TextLog::Print(dump,"null curve pointer\n");
      local_78.z = ON_3dPoint::UnsetPoint.z;
      local_78.x._0_4_ = ON_3dPoint::UnsetPoint.x._0_4_;
      local_78.x._4_4_ = ON_3dPoint::UnsetPoint.x._4_4_;
      local_78.y._0_4_ = ON_3dPoint::UnsetPoint.y._0_4_;
      local_78.y._4_4_ = ON_3dPoint::UnsetPoint.y._4_4_;
    }
    else {
      (*(pOVar2->super_ON_Geometry).super_ON_Object._vptr_ON_Object[7])(pOVar2,dump);
      ON_Curve::PointAtEnd(&local_60,(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[uVar6]);
      local_78.z = local_60.z;
      local_78.x._0_4_ = local_60.x._0_4_;
      local_78.x._4_4_ = local_60.x._4_4_;
      local_78.y._0_4_ = local_60.y._0_4_;
      local_78.y._4_4_ = local_60.y._4_4_;
    }
    ON_TextLog::PopIndent(dump);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void ON_PolyCurve::Dump( ON_TextLog& dump ) const
{
  const int count = Count();
  int i;

  ON_3dPoint segment_start = ON_3dPoint::UnsetPoint;
  ON_3dPoint segment_end = ON_3dPoint::UnsetPoint;
  double gap;

  dump.Print( "ON_PolyCurve segment count = %d\n", count );
  dump.PushIndent();
  for ( i = 0; i < count; i++ )
  {
    if ( 0 != m_segment[i] )
      segment_start = m_segment[i]->PointAtStart();
    else
      segment_start = ON_3dPoint::UnsetPoint;
    gap = (segment_start.IsValid() && segment_end.IsValid())
        ? segment_start.DistanceTo(segment_end)
        : ON_UNSET_VALUE;
    dump.Print( "Segment %d: (%g,%g)", i+1, m_t[i], m_t[i+1] );
    if ( i > 0 )
    {
      if ( ON_IsValid(gap) )
        dump.Print(" gap = %.17g",gap);
      else if ( !segment_start.IsValid() )
        dump.Print(" invalid segment curve");
      else if ( !segment_end.IsValid() )
        dump.Print(" invalid previous segment curve");
    }
    dump.Print("\n");

    dump.PushIndent();
    if ( 0 == m_segment[i] )
    {
      dump.Print("null curve pointer\n");
      segment_end = ON_3dPoint::UnsetPoint;
    }
    else
    {
      m_segment[i]->Dump(dump);
      segment_end = m_segment[i]->PointAtEnd();
    }
    dump.PopIndent();
  }
  dump.PopIndent();
}